

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O0

void spell_hunters_strength(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  int in_EDI;
  float fVar2;
  float fVar3;
  __type_conflict2 _Var4;
  float bcr;
  AFFECT_DATA af;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar5;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RDX,in_EDI);
  if ((bVar1) ||
     (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
     bVar1)) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    init_affect((AFFECT_DATA *)0x651868);
    get_skill((CHAR_DATA *)af.beat_fun,af._92_4_);
    affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    _Var4 = std::sqrt<short>(0);
    fVar2 = (float)(_Var4 / 2.0);
    fVar3 = (float)((int)in_RDX->level / 7);
    if (1.0 <= fVar2) {
      in_stack_ffffffffffffff68 = fVar2;
      fVar5 = fVar2;
      if (31.0 < fVar2) {
        in_stack_ffffffffffffff68 = 31.0;
        fVar5 = 31.0;
      }
    }
    else {
      fVar5 = 1.0;
    }
    affect_to_char((CHAR_DATA *)CONCAT44(fVar2,fVar3),
                   (AFFECT_DATA *)CONCAT44(fVar5,in_stack_ffffffffffffff68));
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(void *)CONCAT44(fVar2,fVar3),
        (void *)CONCAT44(fVar5,in_stack_ffffffffffffff68),0);
  }
  return;
}

Assistant:

void spell_hunters_strength(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	float bcr;

	if (is_affected(ch, sn) || is_npc(ch))
	{
		send_to_char("You already have the enhanced strength of a hunter.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = sn;
	af.location = APPLY_STR;
	af.modifier = ch->pcdata->cabal_level + 2;
	af.level = level;
	af.duration = (get_skill(ch, sn) - 60);
	affect_to_char(ch, &af);

	af.location = APPLY_DAMROLL;
	bcr = sqrt(ch->pcdata->bounty_credits) / 2;
	af.modifier = (int)(ch->level / 7 + URANGE(1, bcr, 31));
	affect_to_char(ch, &af);

	send_to_char("You feel your body surge with the newfound strength of a hunter seeking his prey!\n\r", ch);
	act("$n seems to move with a newfound strength and agility.", ch, 0, 0, TO_ROOM);
}